

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O1

void __thiscall
MemPlumberInternal::staticMemAllocation
          (MemPlumberInternal *this,size_t *memCount,uint64_t *memSize,bool verbose,
          char *fileDumperName,bool append)

{
  FILE *__stream;
  undefined7 in_register_00000009;
  new_ptr_list_t *pnVar1;
  int index;
  long lVar2;
  
  __stream = (FILE *)0x0;
  *memCount = 0;
  *memSize = 0;
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    __stream = (FILE *)openFile(this,fileDumperName,append);
  }
  lVar2 = 0;
  do {
    for (pnVar1 = this->m_StaticPointerListHashtable[lVar2]; pnVar1 != (new_ptr_list_t *)0x0;
        pnVar1 = pnVar1->next) {
      if (verbose) {
        fprintf(__stream,"Static object allocated at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                pnVar1 + 1,(ulong)(uint)pnVar1->size,pnVar1->file,(ulong)(uint)pnVar1->line);
      }
      *memCount = *memCount + 1;
      *memSize = *memSize + pnVar1->size;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4000);
  closeFile(this,(FILE *)__stream);
  return;
}

Assistant:

void staticMemAllocation(size_t& memCount, uint64_t& memSize, bool verbose, const char* fileDumperName, bool append) {
        memCount = 0;
        memSize = 0;

        FILE* dumper = NULL;
        if (verbose) {
            dumper = openFile(fileDumperName, append);
        }

        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_StaticPointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {

                if (verbose) {
                    fprintf(dumper, "Static object allocated at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                        (char*) metaDataBucketLinkedListElement + sizeof(new_ptr_list_t), 
                        (int) metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                memCount++;
                memSize += (uint64_t)metaDataBucketLinkedListElement->size;

                // go to the next item on the list
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
            }
        }

        closeFile(dumper);
    }